

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall
ThreadContext::RegisterLazyBailout
          (ThreadContext *this,PropertyId propertyId,EntryPointInfo *entryPoint)

{
  Type *addr;
  Type pRVar1;
  PropertyRecord *propertyRecord;
  PropertyGuardEntry *pPVar2;
  Recycler *alloc;
  WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
  *this_00;
  undefined1 local_60 [8];
  TrackAllocData data;
  bool foundExistingGuard;
  
  propertyRecord = GetPropertyName(this,propertyId);
  pPVar2 = EnsurePropertyGuardEntry(this,propertyRecord,(bool *)&data.field_0x27);
  addr = &pPVar2->entryPoints;
  if ((pPVar2->entryPoints).ptr ==
      (WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
       *)0x0) {
    local_60 = (undefined1  [8])
               &JsUtil::
                WeaklyReferencedKeyDictionary<Js::EntryPointInfo,unsigned_char,DefaultComparer<Js::EntryPointInfo_const*>,true>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_3154530;
    data.filename._0_4_ = 0xdd4;
    alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    this_00 = (WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
               *)new<Memory::Recycler>(0x50,alloc,0x38bbb2);
    pRVar1 = this->recycler;
    this_00->size = 0;
    this_00->count = 0;
    this_00->version = 0;
    this_00->freeList = 0;
    this_00->freeCount = 0;
    (this_00->buckets).ptr = (int *)0x0;
    (this_00->entries).ptr = (WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char> *)0x0;
    this_00->recycler = pRVar1;
    (this_00->entryRemovalCallback).cookie.ptr = (void *)0x0;
    this_00->lastWeakReferenceCleanupId = pRVar1->weakReferenceCleanupId;
    this_00->disableCleanup = false;
    this_00->modFunctionIndex = 0x4b;
    (this_00->entryRemovalCallback).fnCallback = (Type)0x0;
    JsUtil::
    WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
    ::Initialize(this_00,3);
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = this_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  JsUtil::
  WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
  ::Insert(addr->ptr,entryPoint,'\0',true,false);
  return;
}

Assistant:

void
ThreadContext::RegisterLazyBailout(Js::PropertyId propertyId, Js::EntryPointInfo* entryPoint)
{
    const Js::PropertyRecord * propertyRecord = GetPropertyName(propertyId);

    bool foundExistingGuard;
    PropertyGuardEntry* entry = EnsurePropertyGuardEntry(propertyRecord, foundExistingGuard);
    if (!entry->entryPoints)
    {
        entry->entryPoints = RecyclerNew(recycler, PropertyGuardEntry::EntryPointDictionary, recycler, /*capacity*/ 3);
    }
    entry->entryPoints->UncheckedAdd(entryPoint, NULL);
}